

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O3

bool __thiscall SQInstance::GetMetaMethod(SQInstance *this,SQVM *v,SQMetaMethod mm,SQObjectPtr *res)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQObjectType SVar4;
  SQClass *pSVar5;
  SQTable *pSVar6;
  SQTable *pSVar7;
  
  pSVar5 = this->_class;
  SVar2 = pSVar5->_metamethods[mm].super_SQObject._type;
  if (SVar2 != OT_NULL) {
    SVar3 = (res->super_SQObject)._type;
    pSVar6 = (res->super_SQObject)._unVal.pTable;
    pSVar7 = pSVar5->_metamethods[mm].super_SQObject._unVal.pTable;
    (res->super_SQObject)._unVal.pTable = pSVar7;
    SVar4 = pSVar5->_metamethods[mm].super_SQObject._type;
    (res->super_SQObject)._type = SVar4;
    if ((SVar4 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  return SVar2 != OT_NULL;
}

Assistant:

bool SQInstance::GetMetaMethod(SQVM* SQ_UNUSED_ARG(v),SQMetaMethod mm,SQObjectPtr &res)
{
    if(type(_class->_metamethods[mm]) != OT_NULL) {
        res = _class->_metamethods[mm];
        return true;
    }
    return false;
}